

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapRegexInfo(SnapObject *snpObject,InflateMap *inflator)

{
  uint32 *puVar1;
  ScriptContext *pSVar2;
  Var lastVar;
  RecyclableObject *pRVar3;
  
  pSVar2 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  if (snpObject->SnapObjectTag == SnapRegexObject) {
    puVar1 = (uint32 *)snpObject->AddtlSnapObjectInfo;
    if (*(TTDVar *)(puVar1 + 6) == (TTDVar)0x0) {
      lastVar = (Var)0x0;
    }
    else {
      lastVar = InflateMap::InflateTTDVar(inflator,*(TTDVar *)(puVar1 + 6));
    }
    pRVar3 = Js::JavascriptLibrary::CreateRegex_TTD
                       ((pSVar2->super_ScriptContextBase).javascriptLibrary,*(char16 **)(puVar1 + 2)
                        ,*puVar1,*(RegexFlags *)(puVar1 + 4),puVar1[5],lastVar);
    return pRVar3;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapRegexInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            //Regexes are not too common and have some mutable state so it seems easiest to always re-create them.
            //We can re-evaluate this choice later if needed.

            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapRegexInfo* regexInfo = SnapObjectGetAddtlInfoAs<SnapRegexInfo*, SnapObjectType::SnapRegexObject>(snpObject);

            Js::Var lastVar = (regexInfo->LastIndexVar != nullptr) ? inflator->InflateTTDVar(regexInfo->LastIndexVar) : nullptr;

            return ctx->GetLibrary()->CreateRegex_TTD(regexInfo->RegexStr.Contents, regexInfo->RegexStr.Length, regexInfo->Flags, regexInfo->LastIndexOrFlag, lastVar);
        }